

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::SELU_x86_fma::forward_inplace(SELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  undefined1 auVar8 [32];
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  undefined1 (*pauVar14) [32];
  long lVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar26 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 extraout_var [60];
  
  iVar7 = bottom_top_blob->c;
  if (0 < (long)iVar7) {
    uVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    lVar15 = 0;
    auVar47 = ZEXT3264(CONCAT428(0x3f000000,
                                 CONCAT424(0x3f000000,
                                           CONCAT420(0x3f000000,
                                                     CONCAT416(0x3f000000,
                                                               CONCAT412(0x3f000000,
                                                                         CONCAT48(0x3f000000,
                                                                                  0x3f0000003f000000
                                                                                 )))))));
    auVar50 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      auVar51._8_4_ = 0x3e2aaaaa;
      auVar51._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar49._8_4_ = 0x3d2aa9c1;
      auVar49._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar46._8_4_ = 0x3c088908;
      auVar46._0_8_ = 0x3c0889083c088908;
      auVar44._8_4_ = 0x39506967;
      auVar44._0_8_ = 0x3950696739506967;
      auVar51._12_4_ = 0x3e2aaaaa;
      auVar49._12_4_ = 0x3d2aa9c1;
      auVar46._12_4_ = 0x3c088908;
      auVar44._12_4_ = 0x39506967;
      auVar51._16_4_ = 0x3e2aaaaa;
      auVar49._16_4_ = 0x3d2aa9c1;
      auVar46._16_4_ = 0x3c088908;
      auVar44._16_4_ = 0x39506967;
      auVar51._20_4_ = 0x3e2aaaaa;
      auVar49._20_4_ = 0x3d2aa9c1;
      auVar46._20_4_ = 0x3c088908;
      auVar44._20_4_ = 0x39506967;
      auVar51._24_4_ = 0x3e2aaaaa;
      auVar49._24_4_ = 0x3d2aa9c1;
      auVar46._24_4_ = 0x3c088908;
      auVar44._24_4_ = 0x39506967;
      auVar51._28_4_ = 0x3e2aaaaa;
      auVar49._28_4_ = 0x3d2aa9c1;
      auVar46._28_4_ = 0x3c088908;
      auVar44._28_4_ = 0x39506967;
      pauVar14 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar15 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar1 = (this->super_SELU).alpha;
      uVar4 = (this->super_SELU).lambda;
      auVar19._4_4_ = uVar4;
      auVar19._0_4_ = uVar1;
      auVar19._8_8_ = 0;
      if ((int)uVar13 < 8) {
        uVar11 = 0;
      }
      else {
        auVar52 = vshufps_avx(auVar19,auVar19,0);
        auVar17._16_16_ = auVar52;
        auVar17._0_16_ = auVar52;
        auVar19 = vshufps_avx(auVar19,auVar19,0x55);
        iVar9 = 7;
        auVar52._8_4_ = 0x3f800000;
        auVar52._0_8_ = 0x3f8000003f800000;
        auVar52._12_4_ = 0x3f800000;
        do {
          auVar25 = vminps_avx(*pauVar14,ZEXT1632(ZEXT816(0) << 0x40));
          auVar28._8_4_ = 0x42b0c0a5;
          auVar28._0_8_ = 0x42b0c0a542b0c0a5;
          auVar28._12_4_ = 0x42b0c0a5;
          auVar28._16_4_ = 0x42b0c0a5;
          auVar28._20_4_ = 0x42b0c0a5;
          auVar28._24_4_ = 0x42b0c0a5;
          auVar28._28_4_ = 0x42b0c0a5;
          auVar25 = vminps_avx(auVar25,auVar28);
          auVar29._8_4_ = 0xc2b0c0a5;
          auVar29._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar29._12_4_ = 0xc2b0c0a5;
          auVar29._16_4_ = 0xc2b0c0a5;
          auVar29._20_4_ = 0xc2b0c0a5;
          auVar29._24_4_ = 0xc2b0c0a5;
          auVar29._28_4_ = 0xc2b0c0a5;
          auVar8 = vmaxps_avx(auVar25,auVar29);
          auVar30._8_4_ = 0x3fb8aa3b;
          auVar30._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar30._12_4_ = 0x3fb8aa3b;
          auVar30._16_4_ = 0x3fb8aa3b;
          auVar30._20_4_ = 0x3fb8aa3b;
          auVar30._24_4_ = 0x3fb8aa3b;
          auVar30._28_4_ = 0x3fb8aa3b;
          auVar21 = vfmadd213ps_fma(auVar30,auVar8,auVar47._0_32_);
          auVar23 = vroundps_avx(ZEXT1632(auVar21),1);
          auVar25 = vcmpps_avx(ZEXT1632(auVar21),auVar23,1);
          auVar25 = vandps_avx(auVar50._0_32_,auVar25);
          auVar25 = vsubps_avx(auVar23,auVar25);
          auVar36._8_4_ = 0x3f318000;
          auVar36._0_8_ = 0x3f3180003f318000;
          auVar36._12_4_ = 0x3f318000;
          auVar36._16_4_ = 0x3f318000;
          auVar36._20_4_ = 0x3f318000;
          auVar36._24_4_ = 0x3f318000;
          auVar36._28_4_ = 0x3f318000;
          auVar21 = vfmsub231ps_fma(auVar8,auVar25,auVar36);
          auVar37._8_4_ = 0x395e8083;
          auVar37._0_8_ = 0x395e8083395e8083;
          auVar37._12_4_ = 0x395e8083;
          auVar37._16_4_ = 0x395e8083;
          auVar37._20_4_ = 0x395e8083;
          auVar37._24_4_ = 0x395e8083;
          auVar37._28_4_ = 0x395e8083;
          auVar26 = vfmsub231ps_fma(ZEXT1632(auVar21),auVar25,auVar37);
          auVar23 = ZEXT1632(auVar26);
          auVar8._28_4_ = 0x395e8083;
          auVar8._0_28_ =
               ZEXT1628(CONCAT412(auVar26._12_4_ * auVar26._12_4_,
                                  CONCAT48(auVar26._8_4_ * auVar26._8_4_,
                                           CONCAT44(auVar26._4_4_ * auVar26._4_4_,
                                                    auVar26._0_4_ * auVar26._0_4_))));
          auVar55._8_4_ = 0x3ab743ce;
          auVar55._0_8_ = 0x3ab743ce3ab743ce;
          auVar55._12_4_ = 0x3ab743ce;
          auVar55._16_4_ = 0x3ab743ce;
          auVar55._20_4_ = 0x3ab743ce;
          auVar55._24_4_ = 0x3ab743ce;
          auVar55._28_4_ = 0x3ab743ce;
          auVar21 = vfmadd213ps_fma(auVar44,auVar23,auVar55);
          auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar23,auVar46);
          auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar23,auVar49);
          auVar23 = ZEXT1632(auVar26);
          auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar23,auVar51);
          auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar23,auVar47._0_32_);
          auVar43 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar8,auVar23);
          auVar21._0_4_ = (int)auVar25._0_4_;
          auVar21._4_4_ = (int)auVar25._4_4_;
          auVar21._8_4_ = (int)auVar25._8_4_;
          auVar21._12_4_ = (int)auVar25._12_4_;
          auVar24._16_4_ = (int)auVar25._16_4_;
          auVar24._0_16_ = auVar21;
          auVar24._20_4_ = (int)auVar25._20_4_;
          auVar24._24_4_ = (int)auVar25._24_4_;
          auVar24._28_4_ = (int)auVar25._28_4_;
          auVar26 = vpslld_avx(auVar21,0x17);
          auVar21 = vpslld_avx(auVar24._16_16_,0x17);
          auVar21 = vpaddd_avx(auVar52,auVar21);
          auVar26 = vpaddd_avx(auVar52,auVar26);
          auVar25._16_16_ = auVar21;
          auVar25._0_16_ = auVar26;
          auVar31._0_4_ = auVar50._0_4_ + auVar43._0_4_;
          auVar31._4_4_ = auVar50._4_4_ + auVar43._4_4_;
          auVar31._8_4_ = auVar50._8_4_ + auVar43._8_4_;
          auVar31._12_4_ = auVar50._12_4_ + auVar43._12_4_;
          auVar31._16_4_ = auVar50._16_4_ + 0.0;
          auVar31._20_4_ = auVar50._20_4_ + 0.0;
          auVar31._24_4_ = auVar50._24_4_ + 0.0;
          auVar31._28_4_ = auVar50._28_4_ + 0.0;
          auVar21 = vfmsub213ps_fma(auVar25,auVar31,auVar50._0_32_);
          auVar25 = vmaxps_avx(*pauVar14,ZEXT1632(ZEXT816(0) << 0x40));
          auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar17,auVar25);
          auVar23._4_4_ = auVar21._4_4_ * auVar19._4_4_;
          auVar23._0_4_ = auVar21._0_4_ * auVar19._0_4_;
          auVar23._8_4_ = auVar21._8_4_ * auVar19._8_4_;
          auVar23._12_4_ = auVar21._12_4_ * auVar19._12_4_;
          auVar23._16_4_ = auVar19._0_4_ * 0.0;
          auVar23._20_4_ = auVar19._4_4_ * 0.0;
          auVar23._24_4_ = auVar19._8_4_ * 0.0;
          auVar23._28_4_ = auVar25._28_4_;
          *pauVar14 = auVar23;
          pauVar14 = pauVar14 + 1;
          iVar9 = iVar9 + 8;
        } while (iVar9 < (int)uVar13);
        uVar2 = (this->super_SELU).alpha;
        uVar5 = (this->super_SELU).lambda;
        auVar19._4_4_ = uVar5;
        auVar19._0_4_ = uVar2;
        auVar19._8_8_ = 0;
        auVar53 = ZEXT864(0) << 0x20;
        uVar11 = uVar13 & 0xfffffff8;
      }
      auVar43._8_4_ = 0x3f800000;
      auVar43._0_8_ = 0x3f8000003f800000;
      auVar43._12_4_ = 0x3f800000;
      auVar26._8_4_ = 0x42b0c0a5;
      auVar26._0_8_ = 0x42b0c0a542b0c0a5;
      auVar26._12_4_ = 0x42b0c0a5;
      auVar48._8_4_ = 0xc2b0c0a5;
      auVar48._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar48._12_4_ = 0xc2b0c0a5;
      auVar54._8_4_ = 0x3fb8aa3b;
      auVar54._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar54._12_4_ = 0x3fb8aa3b;
      if ((int)(uVar11 | 3) < (int)uVar13) {
        auVar52 = vshufps_avx(auVar19,auVar19,0);
        auVar19 = vshufps_avx(auVar19,auVar19,0x55);
        auVar45._8_4_ = 0x3f000000;
        auVar45._0_8_ = 0x3f0000003f000000;
        auVar45._12_4_ = 0x3f000000;
        uVar10 = uVar11;
        do {
          auVar21 = vminps_avx(auVar53._0_16_,*(undefined1 (*) [16])*pauVar14);
          auVar21 = vminps_avx(auVar21,auVar26);
          auVar22 = vmaxps_avx(auVar48,auVar21);
          auVar21 = vfmadd213ps_fma(auVar54,auVar22,auVar45);
          auVar32._0_4_ = (int)auVar21._0_4_;
          auVar32._4_4_ = (int)auVar21._4_4_;
          auVar32._8_4_ = (int)auVar21._8_4_;
          auVar32._12_4_ = (int)auVar21._12_4_;
          auVar20 = vcvtdq2ps_avx(auVar32);
          auVar21 = vcmpps_avx(auVar21,auVar20,1);
          auVar21 = vandps_avx(auVar43,auVar21);
          auVar21 = vsubps_avx(auVar20,auVar21);
          auVar33._8_4_ = 0x3f318000;
          auVar33._0_8_ = 0x3f3180003f318000;
          auVar33._12_4_ = 0x3f318000;
          auVar20 = vfmsub231ps_fma(auVar22,auVar21,auVar33);
          auVar34._8_4_ = 0x395e8083;
          auVar34._0_8_ = 0x395e8083395e8083;
          auVar34._12_4_ = 0x395e8083;
          auVar22 = vfmsub231ps_fma(auVar20,auVar21,auVar34);
          auVar35._0_4_ = auVar22._0_4_ * auVar22._0_4_;
          auVar35._4_4_ = auVar22._4_4_ * auVar22._4_4_;
          auVar35._8_4_ = auVar22._8_4_ * auVar22._8_4_;
          auVar35._12_4_ = auVar22._12_4_ * auVar22._12_4_;
          auVar38._8_4_ = 0x39506967;
          auVar38._0_8_ = 0x3950696739506967;
          auVar38._12_4_ = 0x39506967;
          auVar39._8_4_ = 0x3ab743ce;
          auVar39._0_8_ = 0x3ab743ce3ab743ce;
          auVar39._12_4_ = 0x3ab743ce;
          auVar20 = vfmadd213ps_fma(auVar38,auVar22,auVar39);
          auVar40._8_4_ = 0x3c088908;
          auVar40._0_8_ = 0x3c0889083c088908;
          auVar40._12_4_ = 0x3c088908;
          auVar20 = vfmadd213ps_fma(auVar20,auVar22,auVar40);
          auVar41._8_4_ = 0x3d2aa9c1;
          auVar41._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar41._12_4_ = 0x3d2aa9c1;
          auVar20 = vfmadd213ps_fma(auVar20,auVar22,auVar41);
          auVar42._8_4_ = 0x3e2aaaaa;
          auVar42._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar42._12_4_ = 0x3e2aaaaa;
          auVar20 = vfmadd213ps_fma(auVar20,auVar22,auVar42);
          auVar20 = vfmadd213ps_fma(auVar20,auVar22,auVar45);
          auVar20 = vfmadd213ps_fma(auVar20,auVar35,auVar22);
          auVar22._0_4_ = auVar20._0_4_ + 1.0;
          auVar22._4_4_ = auVar20._4_4_ + 1.0;
          auVar22._8_4_ = auVar20._8_4_ + 1.0;
          auVar22._12_4_ = auVar20._12_4_ + 1.0;
          auVar27._0_4_ = (int)auVar21._0_4_;
          auVar27._4_4_ = (int)auVar21._4_4_;
          auVar27._8_4_ = (int)auVar21._8_4_;
          auVar27._12_4_ = (int)auVar21._12_4_;
          auVar21 = vpslld_avx(auVar27,0x17);
          auVar21 = vpaddd_avx(auVar43,auVar21);
          auVar20 = vfmsub213ps_fma(auVar21,auVar22,auVar43);
          auVar21 = vmaxps_avx(auVar53._0_16_,*(undefined1 (*) [16])*pauVar14);
          auVar21 = vfmadd213ps_fma(auVar20,auVar52,auVar21);
          auVar20._0_4_ = auVar21._0_4_ * auVar19._0_4_;
          auVar20._4_4_ = auVar21._4_4_ * auVar19._4_4_;
          auVar20._8_4_ = auVar21._8_4_ * auVar19._8_4_;
          auVar20._12_4_ = auVar21._12_4_ * auVar19._12_4_;
          *(undefined1 (*) [16])*pauVar14 = auVar20;
          pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
          uVar11 = uVar10 + 4;
          iVar9 = uVar10 + 7;
          uVar10 = uVar11;
        } while (iVar9 < (int)uVar13);
        uVar3 = (this->super_SELU).alpha;
        uVar6 = (this->super_SELU).lambda;
        auVar19._4_4_ = uVar6;
        auVar19._0_4_ = uVar3;
        auVar19._8_8_ = 0;
      }
      if (uVar13 - uVar11 != 0 && (int)uVar11 <= (int)uVar13) {
        auVar52 = vmovshdup_avx(auVar19);
        lVar12 = 0;
        do {
          fVar16 = *(float *)(*pauVar14 + lVar12 * 4);
          if (0.0 <= fVar16) {
            fVar16 = fVar16 * (this->super_SELU).lambda;
          }
          else {
            auVar18._0_4_ = expf(fVar16);
            auVar18._4_60_ = extraout_var;
            auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar50 = ZEXT3264(CONCAT428(0x3f800000,
                                         CONCAT424(0x3f800000,
                                                   CONCAT420(0x3f800000,
                                                             CONCAT416(0x3f800000,
                                                                       CONCAT412(0x3f800000,
                                                                                 CONCAT48(0x3f800000
                                                                                          ,
                                                  0x3f8000003f800000)))))));
            auVar47 = ZEXT3264(CONCAT428(0x3f000000,
                                         CONCAT424(0x3f000000,
                                                   CONCAT420(0x3f000000,
                                                             CONCAT416(0x3f000000,
                                                                       CONCAT412(0x3f000000,
                                                                                 CONCAT48(0x3f000000
                                                                                          ,
                                                  0x3f0000003f000000)))))));
            auVar21 = ZEXT416((uint)(auVar52._0_4_ * auVar19._0_4_));
            auVar21 = vfmsub213ss_fma(auVar18._0_16_,auVar21,auVar21);
            fVar16 = auVar21._0_4_;
          }
          *(float *)(*pauVar14 + lVar12 * 4) = fVar16;
          lVar12 = lVar12 + 1;
        } while (uVar13 - uVar11 != (int)lVar12);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != iVar7);
  }
  return 0;
}

Assistant:

int SELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}